

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfrobjs.c
# Opt level: O0

FT_Error pfr_face_init(FT_Stream stream,FT_Face pfrface,FT_Int face_index,FT_Int num_params,
                      FT_Parameter *params)

{
  FT_UInt32 size_00;
  uint uVar1;
  FT_Face pFVar2;
  FT_Bool FVar3;
  FT_Bitmap_Size *pFVar4;
  ulong uVar5;
  undefined1 local_90 [8];
  FT_CharMapRec charmap;
  PFR_Char gchar;
  FT_UInt count_1;
  FT_Int max;
  FT_Memory memory;
  PFR_Strike strike;
  FT_Bitmap_Size *size;
  uint local_50;
  FT_UInt count;
  FT_UInt n;
  FT_UInt nn;
  PFR_PhyFont phy_font;
  FT_Long num_faces;
  FT_Face pFStack_30;
  FT_Error error;
  PFR_Face face;
  FT_Parameter *params_local;
  FT_Int num_params_local;
  FT_Int face_index_local;
  FT_Face pfrface_local;
  FT_Stream stream_local;
  
  pFStack_30 = pfrface;
  face = (PFR_Face)params;
  params_local._0_4_ = num_params;
  params_local._4_4_ = face_index;
  _num_params_local = pfrface;
  pfrface_local = (FT_Face)stream;
  num_faces._4_4_ = pfr_header_load((PFR_Header)(pfrface + 1),stream);
  if (num_faces._4_4_ == 0) {
    FVar3 = pfr_header_check((PFR_Header)(pFStack_30 + 1));
    if (FVar3 == '\0') {
      num_faces._4_4_ = 2;
    }
    else {
      num_faces._4_4_ =
           pfr_log_font_count((FT_Stream)pfrface_local,
                              *(FT_UInt32 *)((long)&pFStack_30[1].face_flags + 4),
                              (FT_Long *)&phy_font);
      if ((num_faces._4_4_ == 0) &&
         (_num_params_local->num_faces = (FT_Long)phy_font, -1 < (int)params_local._4_4_)) {
        if ((long)(int)(params_local._4_4_ & 0xffff) < _num_params_local->num_faces) {
          num_faces._4_4_ =
               pfr_log_font_load((PFR_LogFont)((long)&pFStack_30[1].bbox.xMin + 4),
                                 (FT_Stream)pfrface_local,params_local._4_4_ & 0xffff,
                                 *(FT_UInt32 *)((long)&pFStack_30[1].face_flags + 4),
                                 pFStack_30[1].num_charmaps != 0);
          if ((num_faces._4_4_ == 0) &&
             (size_00._0_2_ = pFStack_30[1].underline_position,
             size_00._2_2_ = pFStack_30[1].underline_thickness,
             num_faces._4_4_ =
                  pfr_phy_font_load((PFR_PhyFont)&pFStack_30[1].size,(FT_Stream)pfrface_local,
                                    *(FT_UInt32 *)&pFStack_30[1].glyph,size_00), pFVar2 = pFStack_30
             , num_faces._4_4_ == 0)) {
            _num_params_local->face_index = (long)(int)(params_local._4_4_ & 0xffff);
            _num_params_local->num_glyphs = (ulong)*(uint *)&pFStack_30[2].generic.data + 1;
            _num_params_local->face_flags = _num_params_local->face_flags | 1;
            count = 0;
            while ((count < *(uint *)&pFStack_30[2].generic.data &&
                   (*(int *)(pFStack_30[2].bbox.xMin + (ulong)count * 0x10 + 0xc) == 0))) {
              count = count + 1;
            }
            if (count == *(FT_UInt *)&pFStack_30[2].generic.data) {
              if (*(int *)&pFStack_30[2].style_name == 0) {
                return 3;
              }
              _num_params_local->face_flags = 0;
            }
            if (((ulong)pFStack_30[1].autohint.data & 4) == 0) {
              _num_params_local->face_flags = _num_params_local->face_flags | 4;
            }
            if (((ulong)pFStack_30[1].autohint.data & 1) == 0) {
              _num_params_local->face_flags = _num_params_local->face_flags | 0x10;
            }
            else {
              _num_params_local->face_flags = _num_params_local->face_flags | 0x20;
            }
            if (*(int *)&pFStack_30[2].style_name != 0) {
              _num_params_local->face_flags = _num_params_local->face_flags | 2;
            }
            if ((int)pFStack_30[2].bbox.yMin != 0) {
              _num_params_local->face_flags = _num_params_local->face_flags | 0x40;
            }
            _num_params_local->family_name = (FT_String *)pFStack_30[2].num_glyphs;
            if (_num_params_local->family_name == (FT_String *)0x0) {
              _num_params_local->family_name = (FT_String *)pFStack_30[2].style_flags;
            }
            _num_params_local->style_name = pFStack_30[2].family_name;
            _num_params_local->num_fixed_sizes = 0;
            _num_params_local->available_sizes = (FT_Bitmap_Size *)0x0;
            (_num_params_local->bbox).xMin = (FT_Pos)pFStack_30[1].memory;
            (_num_params_local->bbox).yMin = (FT_Pos)pFStack_30[1].stream;
            (_num_params_local->bbox).xMax = (FT_Pos)pFStack_30[1].sizes_list.head;
            (_num_params_local->bbox).yMax = (FT_Pos)pFStack_30[1].sizes_list.tail;
            _num_params_local->units_per_EM = (FT_UShort)*(undefined4 *)&pFStack_30[1].driver;
            _num_params_local->ascender = (FT_Short)pFStack_30[1].sizes_list.tail;
            _num_params_local->descender = (FT_Short)pFStack_30[1].stream;
            _num_params_local->height =
                 (FT_Short)((ulong)((uint)_num_params_local->units_per_EM * 0xc) / 10);
            if ((int)_num_params_local->height <
                (int)_num_params_local->ascender - (int)_num_params_local->descender) {
              _num_params_local->height = _num_params_local->ascender - _num_params_local->descender
              ;
            }
            if (*(int *)&pFStack_30[2].style_name != 0) {
              uVar1 = *(uint *)&pFStack_30[2].style_name;
              pFVar4 = (FT_Bitmap_Size *)
                       ft_mem_realloc(_num_params_local->stream->memory,0x20,0,(ulong)uVar1,
                                      (void *)0x0,(FT_Error *)((long)&num_faces + 4));
              _num_params_local->available_sizes = pFVar4;
              if (num_faces._4_4_ != 0) {
                return num_faces._4_4_;
              }
              strike = (PFR_Strike)_num_params_local->available_sizes;
              memory = *(FT_Memory *)&pFVar2[2].num_fixed_sizes;
              for (local_50 = 0; local_50 < uVar1; local_50 = local_50 + 1) {
                *(short *)&strike->x_ppm = (short)*(undefined4 *)((long)&memory->user + 4);
                *(short *)((long)&strike->x_ppm + 2) = (short)*(undefined4 *)&memory->user;
                uVar5 = (ulong)(uint)(*(int *)((long)&memory->user + 4) << 6);
                strike->flags = (int)uVar5;
                strike->gps_size = (int)(uVar5 >> 0x20);
                uVar5 = (ulong)(uint)(*(int *)&memory->user << 6);
                strike->gps_offset = (int)uVar5;
                strike->bct_size = (int)(uVar5 >> 0x20);
                uVar5 = (ulong)(uint)(*(int *)((long)&memory->user + 4) << 6);
                strike->bct_offset = (int)uVar5;
                strike->num_bitmaps = (int)(uVar5 >> 0x20);
                strike = (PFR_Strike)&strike->bitmaps;
                memory = (FT_Memory)&memory[1].alloc;
              }
              _num_params_local->num_fixed_sizes = uVar1;
            }
            if (((ulong)pFVar2[1].autohint.data & 4) == 0) {
              _num_params_local->max_advance_width =
                   (FT_Short)*(undefined4 *)((long)&pFVar2[1].autohint.data + 4);
            }
            else {
              gchar._4_4_ = 0;
              charmap._8_8_ = pFVar2[2].bbox.xMin;
              for (gchar._0_4_ = *(int *)&pFVar2[2].generic.data; (int)gchar != 0;
                  gchar._0_4_ = (int)gchar + -1) {
                if (gchar._4_4_ < *(int *)(charmap._8_8_ + 4)) {
                  gchar._4_4_ = *(int *)(charmap._8_8_ + 4);
                }
                charmap._8_8_ = charmap._8_8_ + 0x10;
              }
              _num_params_local->max_advance_width = (FT_Short)gchar._4_4_;
            }
            _num_params_local->max_advance_height = _num_params_local->height;
            _num_params_local->underline_position =
                 (FT_Short)((long)(int)-(uint)_num_params_local->units_per_EM / 10);
            _num_params_local->underline_thickness = _num_params_local->units_per_EM / 0x1e;
            local_90 = (undefined1  [8])_num_params_local;
            charmap.face._4_2_ = 3;
            charmap.face._6_2_ = 1;
            charmap.face._0_4_ = 0x756e6963;
            num_faces._4_4_ =
                 FT_CMap_New(&pfr_cmap_class_rec,(FT_Pointer)0x0,(FT_CharMap)local_90,
                             (FT_CMap_conflict *)0x0);
            if ((int)pFVar2[2].bbox.yMin != 0) {
              _num_params_local->face_flags = _num_params_local->face_flags | 0x40;
            }
          }
        }
        else {
          num_faces._4_4_ = 6;
        }
      }
    }
  }
  return num_faces._4_4_;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  pfr_face_init( FT_Stream      stream,
                 FT_Face        pfrface,
                 FT_Int         face_index,
                 FT_Int         num_params,
                 FT_Parameter*  params )
  {
    PFR_Face  face = (PFR_Face)pfrface;
    FT_Error  error;

    FT_UNUSED( num_params );
    FT_UNUSED( params );


    FT_TRACE2(( "PFR driver\n" ));

    /* load the header and check it */
    error = pfr_header_load( &face->header, stream );
    if ( error )
      goto Exit;

    if ( !pfr_header_check( &face->header ) )
    {
      FT_TRACE2(( "  not a PFR font\n" ));
      error = FT_THROW( Unknown_File_Format );
      goto Exit;
    }

    /* check face index */
    {
      FT_Long  num_faces;


      error = pfr_log_font_count( stream,
                                  face->header.log_dir_offset,
                                  &num_faces );
      if ( error )
        goto Exit;

      pfrface->num_faces = num_faces;
    }

    if ( face_index < 0 )
      goto Exit;

    if ( ( face_index & 0xFFFF ) >= pfrface->num_faces )
    {
      FT_ERROR(( "pfr_face_init: invalid face index\n" ));
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    /* load the face */
    error = pfr_log_font_load(
              &face->log_font,
              stream,
              (FT_UInt)( face_index & 0xFFFF ),
              face->header.log_dir_offset,
              FT_BOOL( face->header.phy_font_max_size_high != 0 ) );
    if ( error )
      goto Exit;

    /* now load the physical font descriptor */
    error = pfr_phy_font_load( &face->phy_font, stream,
                               face->log_font.phys_offset,
                               face->log_font.phys_size );
    if ( error )
      goto Exit;

    /* now set up all root face fields */
    {
      PFR_PhyFont  phy_font = &face->phy_font;


      pfrface->face_index = face_index & 0xFFFF;
      pfrface->num_glyphs = (FT_Long)phy_font->num_chars + 1;

      pfrface->face_flags |= FT_FACE_FLAG_SCALABLE;

      /* if gps_offset == 0 for all characters, we  */
      /* assume that the font only contains bitmaps */
      {
        FT_UInt  nn;


        for ( nn = 0; nn < phy_font->num_chars; nn++ )
          if ( phy_font->chars[nn].gps_offset != 0 )
            break;

        if ( nn == phy_font->num_chars )
        {
          if ( phy_font->num_strikes > 0 )
            pfrface->face_flags = 0;        /* not scalable */
          else
          {
            FT_ERROR(( "pfr_face_init: font doesn't contain glyphs\n" ));
            error = FT_THROW( Invalid_File_Format );
            goto Exit;
          }
        }
      }

      if ( ( phy_font->flags & PFR_PHY_PROPORTIONAL ) == 0 )
        pfrface->face_flags |= FT_FACE_FLAG_FIXED_WIDTH;

      if ( phy_font->flags & PFR_PHY_VERTICAL )
        pfrface->face_flags |= FT_FACE_FLAG_VERTICAL;
      else
        pfrface->face_flags |= FT_FACE_FLAG_HORIZONTAL;

      if ( phy_font->num_strikes > 0 )
        pfrface->face_flags |= FT_FACE_FLAG_FIXED_SIZES;

      if ( phy_font->num_kern_pairs > 0 )
        pfrface->face_flags |= FT_FACE_FLAG_KERNING;

      /* If no family name was found in the `undocumented' auxiliary
       * data, use the font ID instead.  This sucks but is better than
       * nothing.
       */
      pfrface->family_name = phy_font->family_name;
      if ( !pfrface->family_name )
        pfrface->family_name = phy_font->font_id;

      /* note that the style name can be NULL in certain PFR fonts,
       * probably meaning `Regular'
       */
      pfrface->style_name = phy_font->style_name;

      pfrface->num_fixed_sizes = 0;
      pfrface->available_sizes = NULL;

      pfrface->bbox         = phy_font->bbox;
      pfrface->units_per_EM = (FT_UShort)phy_font->outline_resolution;
      pfrface->ascender     = (FT_Short) phy_font->bbox.yMax;
      pfrface->descender    = (FT_Short) phy_font->bbox.yMin;

      pfrface->height = (FT_Short)( ( pfrface->units_per_EM * 12 ) / 10 );
      if ( pfrface->height < pfrface->ascender - pfrface->descender )
        pfrface->height = (FT_Short)(pfrface->ascender - pfrface->descender);

      if ( phy_font->num_strikes > 0 )
      {
        FT_UInt          n, count = phy_font->num_strikes;
        FT_Bitmap_Size*  size;
        PFR_Strike       strike;
        FT_Memory        memory = pfrface->stream->memory;


        if ( FT_NEW_ARRAY( pfrface->available_sizes, count ) )
          goto Exit;

        size   = pfrface->available_sizes;
        strike = phy_font->strikes;
        for ( n = 0; n < count; n++, size++, strike++ )
        {
          size->height = (FT_Short)strike->y_ppm;
          size->width  = (FT_Short)strike->x_ppm;
          size->size   = (FT_Pos)( strike->y_ppm << 6 );
          size->x_ppem = (FT_Pos)( strike->x_ppm << 6 );
          size->y_ppem = (FT_Pos)( strike->y_ppm << 6 );
        }
        pfrface->num_fixed_sizes = (FT_Int)count;
      }

      /* now compute maximum advance width */
      if ( ( phy_font->flags & PFR_PHY_PROPORTIONAL ) == 0 )
        pfrface->max_advance_width = (FT_Short)phy_font->standard_advance;
      else
      {
        FT_Int    max = 0;
        FT_UInt   count = phy_font->num_chars;
        PFR_Char  gchar = phy_font->chars;


        for ( ; count > 0; count--, gchar++ )
        {
          if ( max < gchar->advance )
            max = gchar->advance;
        }

        pfrface->max_advance_width = (FT_Short)max;
      }

      pfrface->max_advance_height = pfrface->height;

      pfrface->underline_position  = (FT_Short)( -pfrface->units_per_EM / 10 );
      pfrface->underline_thickness = (FT_Short)(  pfrface->units_per_EM / 30 );

      /* create charmap */
      {
        FT_CharMapRec  charmap;


        charmap.face        = pfrface;
        charmap.platform_id = TT_PLATFORM_MICROSOFT;
        charmap.encoding_id = TT_MS_ID_UNICODE_CS;
        charmap.encoding    = FT_ENCODING_UNICODE;

        error = FT_CMap_New( &pfr_cmap_class_rec, NULL, &charmap, NULL );
      }

      /* check whether we have loaded any kerning pairs */
      if ( phy_font->num_kern_pairs )
        pfrface->face_flags |= FT_FACE_FLAG_KERNING;
    }

  Exit:
    return error;
  }